

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<unsigned_long,TTD::TopLevelFunctionInContextRelation,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
MapAndRemoveIf<TTD::ScriptContextTTD::CleanUnreachableTopLevelBodies(JsUtil::BaseHashSet<Js::FunctionBody*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::FunctionBody*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>const&)::__1>
          (BaseDictionary<unsigned_long,TTD::TopLevelFunctionInContextRelation,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,anon_class_16_2_f9f3fafc fn)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int nextIndex;
  int lastIndex;
  int currentIndex;
  uint i;
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  anon_class_16_2_f9f3fafc fn_local;
  
  fn_local.liveTopLevelBodies =
       (BaseHashSet<Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)fn.this;
  this_local = (BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)fn.liveTopLevelBodies;
  for (lastIndex = 0; (uint)lastIndex < *(uint *)(this + 0x1c); lastIndex = lastIndex + 1) {
    if (*(int *)(*(long *)this + (ulong)(uint)lastIndex * 4) != -1) {
      local_2c = -1;
      nextIndex = *(int *)(*(long *)this + (ulong)(uint)lastIndex * 4);
      while (nextIndex != -1) {
        bVar2 = TTD::ScriptContextTTD::CleanUnreachableTopLevelBodies::anon_class_16_2_f9f3fafc::
                operator()((anon_class_16_2_f9f3fafc *)&this_local,
                           (SimpleDictionaryEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation>
                            *)(*(long *)(this + 8) + (long)nextIndex * 0x20));
        if (bVar2) {
          iVar1 = *(int *)(*(long *)(this + 8) + (long)nextIndex * 0x20 + 0x10);
          BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::RemoveAt((BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this,nextIndex,local_2c,lastIndex);
          nextIndex = iVar1;
        }
        else {
          local_2c = nextIndex;
          nextIndex = *(int *)(*(long *)(this + 8) + (long)nextIndex * 0x20 + 0x10);
        }
      }
    }
  }
  return;
}

Assistant:

void MapAndRemoveIf(Fn fn)
        {
            for (uint i = 0; i < bucketCount; i++)
            {
                if (buckets[i] != -1)
                {
                    for (int currentIndex = buckets[i], lastIndex = -1; currentIndex != -1;)
                    {
                        // If the predicate says we should remove this item
                        if (fn(entries[currentIndex]) == true)
                        {
                            const int nextIndex = entries[currentIndex].next;
                            RemoveAt(currentIndex, lastIndex, i);
                            currentIndex = nextIndex;
                        }
                        else
                        {
                            lastIndex = currentIndex;
                            currentIndex = entries[currentIndex].next;
                        }
                    }
                }
            }
        }